

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationDriveline::IntLoadConstraint_C
          (ChLinkMotorRotationDriveline *this,uint off_L,ChVectorDynamic<> *Qc,double c,
          bool do_clamp,double recovery_clamp)

{
  int iVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined7 in_register_00000009;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qb;
  
  ChLinkMateGeneric::IntLoadConstraint_C
            ((ChLinkMateGeneric *)this,off_L,Qc,c,do_clamp,recovery_clamp);
  iVar1 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  dVar6 = (double)(**(code **)(*(long *)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.
                                         super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.
                                         super_ChLinkBase.super_ChPhysicsItem + 600))(this);
  dVar6 = (dVar6 - (*(double *)(*(long *)&(this->super_ChLinkMotorRotation).field_0x278 + 0x88) -
                   ((this->innershaft2).
                    super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos)) *
          c;
  if ((int)CONCAT71(in_register_00000009,do_clamp) != 0) {
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_8_ = recovery_clamp;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar5 = vxorpd_avx512vl(auVar3,auVar5);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar6;
    auVar5 = vmaxsd_avx(auVar7,auVar5);
    auVar5 = vminsd_avx(auVar5,auVar3);
    dVar6 = auVar5._0_8_;
  }
  uVar4 = (ulong)(iVar1 + off_L);
  if ((long)uVar4 <
      (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar2 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar2[uVar4] = dVar6 + pdVar2[uVar4];
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChLinkMotorRotationDriveline::IntLoadConstraint_C(const unsigned int off_L,
                                       ChVectorDynamic<>& Qc,
                                       const double c,
                                       bool do_clamp,
                                       double recovery_clamp) {
    // First, inherit to parent class
    ChLinkMotorRotation::IntLoadConstraint_C(off_L, Qc, c, do_clamp, recovery_clamp);

    int nc = mask.nconstr;
    // the following always set zero C, so skip them ...
    //innerconstraint1->IntLoadConstraint_C(off_L + nc + 0, Qc, c, do_clamp, recovery_clamp);
    //innerconstraint2->IntLoadConstraint_C(off_L + nc + 1, Qc, c, do_clamp, recovery_clamp);
    // ...and compute custom violation C:
    double cnstr_rot_error =  this->GetMotorRot() - (this->innershaft1->GetPos() - this->innershaft2->GetPos());

    double cnstr_violation = c * cnstr_rot_error;

    if (do_clamp)
        cnstr_violation = ChMin(ChMax(cnstr_violation, -recovery_clamp), recovery_clamp);

    // lump violation in the 1st shaft-3D-1D constraints:
    Qc(off_L + nc + 0) += cnstr_violation;

}